

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixWritableFile::PosixWritableFile
          (PosixWritableFile *this,string *filename,int fd)

{
  bool bVar1;
  int fd_local;
  string *filename_local;
  PosixWritableFile *this_local;
  
  WritableFile::WritableFile(&this->super_WritableFile);
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)&PTR__PosixWritableFile_0011e9b0;
  this->pos_ = 0;
  this->fd_ = fd;
  bVar1 = IsManifest(filename);
  this->is_manifest_ = bVar1;
  std::__cxx11::string::string((string *)&this->filename_,(string *)filename);
  Dirname((PosixWritableFile *)&this->dirname_,&this->filename_);
  return;
}

Assistant:

PosixWritableFile(std::string filename, int fd)
      : pos_(0),
        fd_(fd),
        is_manifest_(IsManifest(filename)),
        filename_(std::move(filename)),
        dirname_(Dirname(filename_)) {}